

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O0

void test_one<char>(locale *l,string *src,string *tgtl,string *tgtu)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  ostream *poVar4;
  undefined8 uVar5;
  int iVar6;
  locale *in_RDI;
  locale *in_stack_fffffffffffffd80;
  allocator *paVar7;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  runtime_error *in_stack_fffffffffffffd90;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  locale *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  allocator local_1f1;
  string local_1f0 [32];
  undefined1 local_1d0 [40];
  locale local_1a8 [8];
  string local_1a0 [32];
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [32];
  locale local_138 [8];
  string local_130 [32];
  locale local_110 [8];
  string local_108 [32];
  string local_e8 [38];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  locale local_a0 [8];
  string local_98 [48];
  locale local_68 [8];
  string local_60 [32];
  string local_40 [56];
  locale *local_8;
  
  test_counter = test_counter + 1;
  local_8 = in_RDI;
  std::locale::locale(local_68,in_RDI);
  to_correct_string<char>
            ((string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  booster::locale::to_upper<char>(in_stack_fffffffffffffda8,(locale *)in_stack_fffffffffffffda0);
  std::locale::locale(local_a0,local_8);
  to_correct_string<char>
            ((string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  _Var2 = std::operator==(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string(local_98);
  std::locale::~locale(local_a0);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::locale::~locale(local_68);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1f);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l)"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar6 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar1) {
      local_c2 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"Error limits reached, stopping unit test",&local_c1);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffffd90,
                 (string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
      local_c2 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::locale::locale(local_110,local_8);
  to_correct_string<char>
            ((string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  booster::locale::to_lower<char>(in_stack_fffffffffffffda8,(locale *)in_stack_fffffffffffffda0);
  std::locale::locale(local_138,local_8);
  to_correct_string<char>
            ((string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  _Var2 = std::operator==(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string(local_130);
  std::locale::~locale(local_138);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::locale::~locale(local_110);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x20);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar6 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar1) {
      local_15a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      paVar7 = &local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"Error limits reached, stopping unit test",paVar7);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffffd90,
                 (string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
      local_15a = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  this_00 = local_1a8;
  std::locale::locale(this_00,local_8);
  to_correct_string<char>
            ((string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  booster::locale::fold_case<char>(in_stack_fffffffffffffda8,(locale *)in_stack_fffffffffffffda0);
  this = (runtime_error *)local_1d0;
  std::locale::locale((locale *)this,local_8);
  to_correct_string<char>
            ((string *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  bVar3 = std::operator==(in_stack_fffffffffffffda0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::locale::~locale((locale *)local_1d0);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_1a0);
  std::locale::~locale(local_1a8);
  if ((bVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x21);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar6 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar1) {
      uVar5 = __cxa_allocate_exception(0x30);
      paVar7 = &local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"Error limits reached, stopping unit test",paVar7);
      booster::runtime_error::runtime_error
                (this,(string *)CONCAT17(bVar3,in_stack_fffffffffffffd88));
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void test_one(std::locale const &l,std::string src,std::string tgtl,std::string tgtu)
{
    TEST(booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l));
    TEST(booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
    TEST(booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
}